

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.h
# Opt level: O0

int default_exception_el(DisasContext_conflict1 *s)

{
  int local_18;
  int local_14;
  DisasContext_conflict1 *s_local;
  
  if ((s->mmu_idx == ARMMMUIdx_SE10_0) && ((s->secure_routed_to_el3 & 1U) != 0)) {
    local_14 = 3;
  }
  else {
    if (s->current_el < 1) {
      local_18 = 1;
    }
    else {
      local_18 = s->current_el;
    }
    local_14 = local_18;
  }
  return local_14;
}

Assistant:

static inline int default_exception_el(DisasContext *s)
{
    /* If we are coming from secure EL0 in a system with a 32-bit EL3, then
     * there is no secure EL1, so we route exceptions to EL3.  Otherwise,
     * exceptions can only be routed to ELs above 1, so we target the higher of
     * 1 or the current EL.
     */
    return (s->mmu_idx == ARMMMUIdx_SE10_0 && s->secure_routed_to_el3)
            ? 3 : MAX(1, s->current_el);
}